

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_read_data_skip_streamable(archive_read *a)

{
  char *pcVar1;
  wchar_t wVar2;
  int64_t iVar3;
  long local_68;
  ssize_t bytes_avail;
  char *buff_1;
  char *p;
  size_t sStack_48;
  wchar_t r_1;
  size_t size;
  void *buff;
  int64_t offset;
  int64_t iStack_28;
  wchar_t r;
  int64_t bytes_skipped;
  zip *zip;
  archive_read *a_local;
  
  bytes_skipped = (int64_t)a->format->data;
  zip = (zip *)a;
  iStack_28 = __archive_read_consume(a,*(int64_t *)(bytes_skipped + 0x68));
  *(undefined8 *)(bytes_skipped + 0x68) = 0;
  if (iStack_28 < 0) {
    a_local._4_4_ = L'\xffffffe2';
  }
  else if (*(char *)(bytes_skipped + 0xa2) == '\0') {
    if (((*(ushort *)(*(long *)(bytes_skipped + 0x70) + 0x7e) & 8) == 0) ||
       (0 < *(long *)(*(long *)(bytes_skipped + 0x70) + 0x28))) {
      iVar3 = __archive_read_consume((archive_read *)zip,*(int64_t *)(bytes_skipped + 0x78));
      if (iVar3 < 0) {
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        a_local._4_4_ = L'\0';
      }
    }
    else {
      if (*(char *)(bytes_skipped + 0x1ef0) != '\0') {
        *(undefined4 *)(bytes_skipped + 0x38) = 1;
        if ((*(ushort *)(*(long *)(bytes_skipped + 0x70) + 0x7e) & 0x40) == 0) {
          if (*(char *)(*(long *)(bytes_skipped + 0x70) + 0x80) == 'c') {
            offset._4_4_ = init_WinZip_AES_decryption((archive_read *)zip);
          }
          else {
            offset._4_4_ = init_traditional_PKWARE_decryption((archive_read *)zip);
          }
        }
        else {
          offset._4_4_ = read_decryption_header((archive_read *)zip);
        }
        if (offset._4_4_ != L'\0') {
          return offset._4_4_;
        }
        *(undefined1 *)(bytes_skipped + 0x1ef0) = 0;
      }
      if (*(char *)(*(long *)(bytes_skipped + 0x70) + 0x80) == '\b') {
        while (*(char *)(bytes_skipped + 0xa2) == '\0') {
          buff = (void *)0x0;
          size = 0;
          sStack_48 = 0;
          wVar2 = zip_read_data_deflate
                            ((archive_read *)zip,(void **)&size,&stack0xffffffffffffffb8,
                             (int64_t *)&buff);
          if (wVar2 != L'\0') {
            return wVar2;
          }
          p._4_4_ = 0;
        }
        a_local._4_4_ = L'\0';
      }
      else {
        while (bytes_avail = (ssize_t)__archive_read_ahead((archive_read *)zip,0x10,&local_68),
              pcVar1 = (char *)bytes_avail, 0xf < local_68) {
          while (buff_1 = pcVar1, buff_1 <= (char *)(bytes_avail + local_68 + -0x10)) {
            if (buff_1[3] == 'P') {
              pcVar1 = buff_1 + 3;
            }
            else if (buff_1[3] == 'K') {
              pcVar1 = buff_1 + 2;
            }
            else if (buff_1[3] == '\a') {
              pcVar1 = buff_1 + 1;
            }
            else {
              if ((((buff_1[3] == '\b') && (buff_1[2] == '\a')) && (buff_1[1] == 'K')) &&
                 (*buff_1 == 'P')) {
                if ((*(byte *)(*(long *)(bytes_skipped + 0x70) + 0x82) & 1) == 0) {
                  __archive_read_consume
                            ((archive_read *)zip,(int64_t)(buff_1 + (0x10 - bytes_avail)));
                }
                else {
                  __archive_read_consume
                            ((archive_read *)zip,(int64_t)(buff_1 + (0x18 - bytes_avail)));
                }
                return L'\0';
              }
              pcVar1 = buff_1 + 4;
            }
          }
          __archive_read_consume((archive_read *)zip,(long)buff_1 - bytes_avail);
        }
        archive_set_error((archive *)zip,0x54,"Truncated ZIP file data");
        a_local._4_4_ = L'\xffffffe2';
      }
    }
  }
  else {
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_zip_read_data_skip_streamable(struct archive_read *a)
{
	struct zip *zip;
	int64_t bytes_skipped;

	zip = (struct zip *)(a->format->data);
	bytes_skipped = __archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	/* If we've already read to end of data, we're done. */
	if (zip->end_of_entry)
		return (ARCHIVE_OK);

	/* So we know we're streaming... */
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    || zip->entry->compressed_size > 0) {
		/* We know the compressed length, so we can just skip. */
		bytes_skipped = __archive_read_consume(a,
					zip->entry_bytes_remaining);
		if (bytes_skipped < 0)
			return (ARCHIVE_FATAL);
		return (ARCHIVE_OK);
	}

	if (zip->init_decryption) {
		int r;

		zip->has_encrypted_entries = 1;
		if (zip->entry->zip_flags & ZIP_STRONG_ENCRYPTED)
			r = read_decryption_header(a);
		else if (zip->entry->compression == WINZIP_AES_ENCRYPTION)
			r = init_WinZip_AES_decryption(a);
		else
			r = init_traditional_PKWARE_decryption(a);
		if (r != ARCHIVE_OK)
			return (r);
		zip->init_decryption = 0;
	}

	/* We're streaming and we don't know the length. */
	/* If the body is compressed and we know the format, we can
	 * find an exact end-of-entry by decompressing it. */
	switch (zip->entry->compression) {
#ifdef HAVE_ZLIB_H
	case 8: /* Deflate compression. */
		while (!zip->end_of_entry) {
			int64_t offset = 0;
			const void *buff = NULL;
			size_t size = 0;
			int r;
			r =  zip_read_data_deflate(a, &buff, &size, &offset);
			if (r != ARCHIVE_OK)
				return (r);
		}
		return ARCHIVE_OK;
#endif
	default: /* Uncompressed or unknown. */
		/* Scan for a PK\007\010 signature. */
		for (;;) {
			const char *p, *buff;
			ssize_t bytes_avail;
			buff = __archive_read_ahead(a, 16, &bytes_avail);
			if (bytes_avail < 16) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated ZIP file data");
				return (ARCHIVE_FATAL);
			}
			p = buff;
			while (p <= buff + bytes_avail - 16) {
				if (p[3] == 'P') { p += 3; }
				else if (p[3] == 'K') { p += 2; }
				else if (p[3] == '\007') { p += 1; }
				else if (p[3] == '\010' && p[2] == '\007'
				    && p[1] == 'K' && p[0] == 'P') {
					if (zip->entry->flags & LA_USED_ZIP64)
						__archive_read_consume(a,
						    p - buff + 24);
					else
						__archive_read_consume(a,
						    p - buff + 16);
					return ARCHIVE_OK;
				} else { p += 4; }
			}
			__archive_read_consume(a, p - buff);
		}
	}
}